

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O1

void __thiscall Fl_Scroll::scroll_to(Fl_Scroll *this,int X,int Y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Widget *pFVar4;
  Fl_Window *pFVar5;
  Fl_Widget **ppFVar6;
  Fl_Window *pFVar7;
  uchar fl;
  long lVar8;
  
  iVar1 = this->xposition_;
  iVar2 = this->yposition_;
  if (iVar2 != Y || iVar1 != X) {
    this->xposition_ = X;
    this->yposition_ = Y;
    ppFVar6 = Fl_Group::array(&this->super_Fl_Group);
    iVar3 = (this->super_Fl_Group).children_;
    if (iVar3 != 0) {
      lVar8 = 0;
      do {
        pFVar4 = ppFVar6[lVar8];
        if ((Fl_Scrollbar *)pFVar4 != &this->scrollbar &&
            (Fl_Scrollbar *)pFVar4 != &this->hscrollbar) {
          (*pFVar4->_vptr_Fl_Widget[4])
                    (pFVar4,(ulong)(uint)(pFVar4->x_ + (iVar1 - X)),
                     (ulong)(uint)(pFVar4->y_ + (iVar2 - Y)),(ulong)(uint)pFVar4->w_,
                     (ulong)(uint)pFVar4->h_);
        }
        lVar8 = lVar8 + 1;
      } while (iVar3 != (int)lVar8);
    }
    pFVar5 = (Fl_Window *)(this->super_Fl_Group).super_Fl_Widget.parent_;
    pFVar7 = Fl_Widget::window((Fl_Widget *)this);
    fl = 0x80;
    if (Fl::scheme_bg_ == (Fl_Image *)0x0) {
      fl = '\x04';
    }
    if (pFVar5 != pFVar7) {
      fl = '\x04';
    }
    Fl_Widget::damage((Fl_Widget *)this,fl);
    return;
  }
  return;
}

Assistant:

void Fl_Scroll::scroll_to(int X, int Y) {
  int dx = xposition_-X;
  int dy = yposition_-Y;
  if (!dx && !dy) return;
  xposition_ = X;
  yposition_ = Y;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (o == &hscrollbar || o == &scrollbar) continue;
    o->position(o->x()+dx, o->y()+dy);
  }
  if (parent() == (Fl_Group *)window() && Fl::scheme_bg_) damage(FL_DAMAGE_ALL);
  else damage(FL_DAMAGE_SCROLL);
}